

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_filter.hpp
# Opt level: O3

string * __thiscall Filter::VSParams_abi_cxx11_(string *__return_storage_ptr__,Filter *this)

{
  char *__s;
  string *psVar1;
  size_t sVar2;
  ostream *poVar3;
  undefined8 *puVar4;
  string type_name;
  vector<Param,_std::allocator<Param>_> params;
  stringstream ss;
  char local_1f9;
  char *local_1f8;
  long local_1f0;
  char local_1e8;
  undefined7 uStack_1e7;
  undefined8 *local_1d8;
  undefined8 *local_1d0;
  long local_1c8;
  string *local_1c0;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_1c0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  (*this->_vptr_Filter[4])(&local_1d8);
  if (local_1d8 != local_1d0) {
    puVar4 = local_1d8;
    do {
      if (*(char *)((long)puVar4 + 0xe) == '\x01') {
        local_1f0 = 0;
        local_1e8 = '\0';
        local_1f8 = &local_1e8;
        if ((ulong)*(uint *)(puVar4 + 1) < 5) {
          std::__cxx11::string::_M_replace
                    ((ulong)&local_1f8,0,(char *)0x0,
                     (ulong)(&DAT_00112560 +
                            *(int *)(&DAT_00112560 + (ulong)*(uint *)(puVar4 + 1) * 4)));
        }
        __s = (char *)*puVar4;
        if (__s == (char *)0x0) {
          std::ios::clear((int)(ostream *)local_1a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
        }
        else {
          sVar2 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar2);
        }
        local_1f9 = ':';
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,&local_1f9,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_1f8,local_1f0);
        if (*(char *)((long)puVar4 + 0xc) == '\x01') {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[]",2);
        }
        if (*(char *)((long)puVar4 + 0xf) == '\x01') {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":opt",4);
        }
        local_1f9 = ';';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1f9,1);
        if (local_1f8 != &local_1e8) {
          operator_delete(local_1f8,CONCAT71(uStack_1e7,local_1e8) + 1);
        }
      }
      puVar4 = puVar4 + 2;
    } while (puVar4 != local_1d0);
  }
  psVar1 = local_1c0;
  std::__cxx11::stringbuf::str();
  if (local_1d8 != (undefined8 *)0x0) {
    operator_delete(local_1d8,local_1c8 - (long)local_1d8);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar1;
}

Assistant:

virtual const std::string VSParams() const
  {
    std::stringstream ss;
    auto params = this->Params();
    for (auto &&p : params)
    {
      if (!p.VSEnabled) continue;
      std::string type_name;
      switch(p.Type) {
        case Clip: type_name = "clip"; break;
        case Integer: type_name = "int"; break;
        case Float: type_name = "float"; break;
        case Boolean: type_name = "int"; break;
        case String: type_name = "data"; break;
      }
      ss << p.Name << ':' << type_name;
      if (p.IsArray)
        ss << "[]";
      if (p.IsOptional)
        ss << ":opt";
      ss << ';';
    }
    return ss.str();
  }